

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

FunctionProxy * __thiscall Js::JavascriptFunction::GetFunctionProxy(JavascriptFunction *this)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo **ppFVar3;
  undefined4 *puVar4;
  FunctionInfo *this_00;
  FunctionProxy *pFVar5;
  JavascriptFunction *this_local;
  
  ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionInfo__
                      ((WriteBarrierPtr *)&this->functionInfo);
  if (*ppFVar3 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x47,"(functionInfo != nullptr)","functionInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(&this->functionInfo);
  pFVar5 = FunctionInfo::GetFunctionProxy(this_00);
  return pFVar5;
}

Assistant:

FunctionProxy *JavascriptFunction::GetFunctionProxy() const
    {
        Assert(functionInfo != nullptr);
        return functionInfo->GetFunctionProxy();
    }